

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_vtab_nochange(sqlite3_context *p)

{
  int iVar1;
  undefined8 *in_RDI;
  
  iVar1 = sqlite3_value_nochange((sqlite3_value *)*in_RDI);
  return iVar1;
}

Assistant:

SQLITE_API int sqlite3_vtab_nochange(sqlite3_context *p){
#ifdef SQLITE_ENABLE_API_ARMOR
  if( p==0 ) return 0;
#else
  assert( p );
#endif
  return sqlite3_value_nochange(p->pOut);
}